

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O2

void __thiscall pbrt::ParsedScene::ParsedScene(ParsedScene *this)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_header *p_Var2;
  ParameterDictionary parameters;
  GraphicsState *this_00;
  undefined1 auVar3 [64];
  ParameterDictionary dict;
  undefined1 in_stack_fffffffffffffd00 [16];
  TransformCache *this_01;
  SceneEntity *this_02;
  vector<pbrt::SceneEntity,_std::allocator<pbrt::SceneEntity>_> *this_03;
  SceneEntity *this_04;
  SceneEntity *this_05;
  SceneEntity *this_06;
  undefined1 in_stack_fffffffffffffd40 [16];
  FileLoc in_stack_fffffffffffffd50;
  string local_280;
  SceneEntity local_260;
  ParameterDictionary local_1c0;
  ParsedParameterVector local_158;
  ParameterDictionary local_f8;
  ParsedParameterVector local_90;
  
  (this->super_SceneRepresentation).errorExit = false;
  (this->super_SceneRepresentation)._vptr_SceneRepresentation = (_func_int **)&PTR_Scale_02f9b9d8;
  this_06 = &this->film;
  SceneEntity::SceneEntity(this_06);
  this_05 = &this->sampler;
  SceneEntity::SceneEntity(this_05);
  this_02 = &this->integrator;
  SceneEntity::SceneEntity(this_02);
  this_04 = &this->filter;
  SceneEntity::SceneEntity(this_04);
  SceneEntity::SceneEntity(&this->accelerator);
  CameraSceneEntity::CameraSceneEntity(&this->camera);
  (this->media)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->media)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->media)._M_t._M_impl.super__Rb_tree_header;
  p_Var2 = &(this->instanceDefinitions)._M_t._M_impl.super__Rb_tree_header;
  this_03 = &this->materials;
  (this->namedMaterials).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SceneEntity>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SceneEntity>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->namedMaterials).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SceneEntity>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SceneEntity>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->namedMaterials).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SceneEntity>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SceneEntity>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->materials).super__Vector_base<pbrt::SceneEntity,_std::allocator<pbrt::SceneEntity>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->namedMaterials).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SceneEntity>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SceneEntity>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->materials).super__Vector_base<pbrt::SceneEntity,_std::allocator<pbrt::SceneEntity>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->materials).super__Vector_base<pbrt::SceneEntity,_std::allocator<pbrt::SceneEntity>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->materials).super__Vector_base<pbrt::SceneEntity,_std::allocator<pbrt::SceneEntity>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar3 = ZEXT464(0) << 0x40;
  (this->media)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->media)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->instanceDefinitions)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->instanceDefinitions)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  *(undefined1 (*) [64])
   &(this->lights).
    super__Vector_base<pbrt::LightSceneEntity,_std::allocator<pbrt::LightSceneEntity>_>._M_impl.
    super__Vector_impl_data._M_finish = auVar3;
  *(undefined1 (*) [64])&(this->media)._M_t._M_impl.super__Rb_tree_header._M_node_count = auVar3;
  *(undefined1 (*) [64])
   &(this->shapes).
    super__Vector_base<pbrt::ShapeSceneEntity,_std::allocator<pbrt::ShapeSceneEntity>_>._M_impl.
    super__Vector_impl_data._M_finish = auVar3;
  (this->instanceDefinitions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var2->_M_header;
  (this->instanceDefinitions)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var2->_M_header;
  (this->instanceDefinitions)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->currentApiState = OptionsBlock;
  TransformSet::TransformSet(&this->curTransform);
  p_Var1 = &(this->namedCoordinateSystems)._M_t._M_impl.super__Rb_tree_header;
  this->activeTransformBits = 3;
  (this->namedCoordinateSystems)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->namedCoordinateSystems)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  this_01 = &this->transformCache;
  (this->namedCoordinateSystems)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->namedCoordinateSystems)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->namedCoordinateSystems)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  TransformCache::TransformCache(this_01);
  this->transformStartTime = 0.0;
  this->transformEndTime = 1.0;
  pbrt::Transform::Transform(&this->renderFromWorld);
  (this->pushedTransforms).
  super__Vector_base<pbrt::TransformSet,_std::allocator<pbrt::TransformSet>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->pushedActiveTransformBits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->pushedActiveTransformBits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->pushedActiveTransformBits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->pushStack).
  super__Vector_base<std::pair<char,_pbrt::FileLoc>,_std::allocator<std::pair<char,_pbrt::FileLoc>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->pushStack).
  super__Vector_base<std::pair<char,_pbrt::FileLoc>,_std::allocator<std::pair<char,_pbrt::FileLoc>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->pushStack).
  super__Vector_base<std::pair<char,_pbrt::FileLoc>,_std::allocator<std::pair<char,_pbrt::FileLoc>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->currentInstance = (InstanceDefinitionSceneEntity *)0x0;
  (this->pushedGraphicsStates).
  super__Vector_base<pbrt::ParsedScene::GraphicsState,_std::allocator<pbrt::ParsedScene::GraphicsState>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->pushedGraphicsStates).
  super__Vector_base<pbrt::ParsedScene::GraphicsState,_std::allocator<pbrt::ParsedScene::GraphicsState>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->pushedGraphicsStates).
  super__Vector_base<pbrt::ParsedScene::GraphicsState,_std::allocator<pbrt::ParsedScene::GraphicsState>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->pushedTransforms).
  super__Vector_base<pbrt::TransformSet,_std::allocator<pbrt::TransformSet>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->pushedTransforms).
  super__Vector_base<pbrt::TransformSet,_std::allocator<pbrt::TransformSet>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->pushedTransforms).
  super__Vector_base<pbrt::TransformSet,_std::allocator<pbrt::TransformSet>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->pushedActiveTransformBits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->pushedActiveTransformBits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this_00 = (GraphicsState *)operator_new(0x2f8);
  GraphicsState::GraphicsState(this_00);
  this->graphicsState = this_00;
  local_90.alloc.memoryResource = pstd::pmr::new_delete_resource();
  local_90.ptr = (ParsedParameter **)0x0;
  local_90.nAlloc = 0;
  local_90.nStored = 0;
  ParameterDictionary::ParameterDictionary(&local_f8,&local_90,RGBColorSpace::sRGB);
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::~InlinedVector(&local_90);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_280,"diffuse",(allocator<char> *)&stack0xfffffffffffffd07);
  ParameterDictionary::ParameterDictionary(&local_1c0,&local_f8);
  parameters.params.field_2.fixed[0] = (ParsedParameter *)0x1;
  parameters.params.alloc.memoryResource = (memory_resource *)0x0;
  parameters.params.ptr = (ParsedParameter **)0x0;
  parameters.params.field_2._8_16_ = in_stack_fffffffffffffd00;
  parameters.params.field_2.fixed[3] = (ParsedParameter *)this_01;
  parameters.params.field_2.fixed[4] = (ParsedParameter *)this_02;
  parameters.params.field_2.fixed[5] = (ParsedParameter *)this_03;
  parameters.params.field_2.fixed[6] = (ParsedParameter *)this_04;
  parameters.params.field_2.fixed[7] = (ParsedParameter *)this_05;
  parameters.params.nAlloc = (size_t)this_06;
  parameters.params.nStored = in_stack_fffffffffffffd40._0_8_;
  parameters.colorSpace = (RGBColorSpace *)in_stack_fffffffffffffd40._8_8_;
  SceneEntity::SceneEntity(&local_260,&local_280,parameters,in_stack_fffffffffffffd50);
  std::vector<pbrt::SceneEntity,_std::allocator<pbrt::SceneEntity>_>::
  emplace_back<pbrt::SceneEntity>(this_03,&local_260);
  SceneEntity::~SceneEntity(&local_260);
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::~InlinedVector(&local_1c0.params);
  std::__cxx11::string::~string((string *)&local_280);
  std::__cxx11::string::assign((char *)&this->accelerator);
  std::__cxx11::string::assign((char *)&this->camera);
  std::__cxx11::string::assign((char *)this_05);
  std::__cxx11::string::assign((char *)this_04);
  std::__cxx11::string::assign((char *)this_06);
  local_158.alloc.memoryResource = pstd::pmr::new_delete_resource();
  local_158.ptr = (ParsedParameter **)0x0;
  local_158.nAlloc = 0;
  local_158.nStored = 0;
  ParameterDictionary::ParameterDictionary
            ((ParameterDictionary *)&local_260,&local_158,RGBColorSpace::sRGB);
  ParameterDictionary::operator=(&(this->film).parameters,(ParameterDictionary *)&local_260);
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::~InlinedVector((InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
                    *)&local_260);
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::~InlinedVector(&local_158);
  std::__cxx11::string::assign((char *)this_02);
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::~InlinedVector(&local_f8.params);
  return;
}

Assistant:

ParsedScene::ParsedScene() {
    // Allocate _graphicsState_
    graphicsState = new GraphicsState;

    // Set scene defaults
    ParameterDictionary dict({}, RGBColorSpace::sRGB);
    materials.push_back(SceneEntity("diffuse", dict, {}));

    accelerator.name = "bvh";

    camera.name = "perspective";

    sampler.name = "pmj02bn";

    filter.name = "gaussian";

    film.name = "rgb";
    film.parameters = ParameterDictionary({}, RGBColorSpace::sRGB);

    integrator.name = "volpath";
}